

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionInfoArray __thiscall
Js::ParseableFunctionInfo::GetNestedFuncArray(ParseableFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->nestedArray).ptr == (NestedArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7dc,"(GetNestedArray() != nullptr)","GetNestedArray() != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (FunctionInfoArray)((this->nestedArray).ptr + 1);
}

Assistant:

FunctionInfoArray ParseableFunctionInfo::GetNestedFuncArray()
    {
        Assert(GetNestedArray() != nullptr);
        return GetNestedArray()->functionInfoArray;
    }